

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles3::Functional::UniformCase::checkUniformDefaultValues
          (UniformCase *this,
          vector<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
          *values,vector<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
                  *basicUniforms)

{
  float fVar1;
  int iVar2;
  bool bVar3;
  size_type sVar4;
  MessageBuilder *pMVar5;
  MessageBuilder local_970;
  MessageBuilder local_7f0;
  int local_66c;
  undefined1 local_668 [4];
  int i_3;
  int local_4e4;
  undefined1 local_4e0 [4];
  int i_2;
  int local_35c;
  undefined1 local_358 [4];
  int i_1;
  int local_1d8;
  int i;
  MessageBuilder local_1c8;
  int local_44;
  const_reference pvStack_40;
  int valSize;
  VarValue *unifValue;
  BasicUniform *uniform;
  int unifNdx;
  bool success;
  TestLog *log;
  vector<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
  *basicUniforms_local;
  vector<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
  *values_local;
  UniformCase *this_local;
  
  log = (TestLog *)basicUniforms;
  basicUniforms_local =
       (vector<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
        *)values;
  values_local = (vector<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
                  *)this;
  _unifNdx = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  uniform._7_1_ = 1;
  for (uniform._0_4_ = 0; iVar2 = (int)uniform,
      sVar4 = std::
              vector<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
              ::size((vector<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
                      *)log), iVar2 < (int)sVar4; uniform._0_4_ = (int)uniform + 1) {
    unifValue = (VarValue *)
                std::
                vector<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
                ::operator[]((vector<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
                              *)log,(long)(int)uniform);
    pvStack_40 = std::
                 vector<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
                 ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
                               *)basicUniforms_local,(long)(int)uniform);
    local_44 = glu::getDataTypeScalarSize((unifValue->val).uintV[7]);
    tcu::TestLog::operator<<(&local_1c8,_unifNdx,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_1c8,(char (*) [21])"// Checking uniform ");
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               unifValue);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c8);
    if (pvStack_40->type != TYPE_INVALID) {
      bVar3 = glu::isDataTypeFloatOrVec((unifValue->val).uintV[7]);
      if ((bVar3) || (bVar3 = glu::isDataTypeMatrix((unifValue->val).uintV[7]), bVar3)) {
        for (local_1d8 = 0; local_1d8 < local_44; local_1d8 = local_1d8 + 1) {
          fVar1 = *(float *)((long)&pvStack_40->val + (long)local_1d8 * 4);
          if ((fVar1 != 0.0) || (NAN(fVar1))) {
            tcu::TestLog::operator<<
                      ((MessageBuilder *)local_358,_unifNdx,
                       (BeginMessageToken *)&tcu::TestLog::Message);
            pMVar5 = tcu::MessageBuilder::operator<<
                               ((MessageBuilder *)local_358,(char (*) [21])"// FAILURE: uniform ");
            pMVar5 = tcu::MessageBuilder::operator<<
                               (pMVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)unifValue);
            pMVar5 = tcu::MessageBuilder::operator<<
                               (pMVar5,(char (*) [28])" has non-zero initial value");
            tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_358);
            uniform._7_1_ = 0;
          }
        }
      }
      else {
        bVar3 = glu::isDataTypeIntOrIVec((unifValue->val).uintV[7]);
        if (bVar3) {
          for (local_35c = 0; local_35c < local_44; local_35c = local_35c + 1) {
            if (*(int *)((long)&pvStack_40->val + (long)local_35c * 4) != 0) {
              tcu::TestLog::operator<<
                        ((MessageBuilder *)local_4e0,_unifNdx,
                         (BeginMessageToken *)&tcu::TestLog::Message);
              pMVar5 = tcu::MessageBuilder::operator<<
                                 ((MessageBuilder *)local_4e0,(char (*) [21])"// FAILURE: uniform ")
              ;
              pMVar5 = tcu::MessageBuilder::operator<<
                                 (pMVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)unifValue);
              pMVar5 = tcu::MessageBuilder::operator<<
                                 (pMVar5,(char (*) [28])" has non-zero initial value");
              tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_4e0);
              uniform._7_1_ = 0;
            }
          }
        }
        else {
          bVar3 = glu::isDataTypeUintOrUVec((unifValue->val).uintV[7]);
          if (bVar3) {
            for (local_4e4 = 0; local_4e4 < local_44; local_4e4 = local_4e4 + 1) {
              if (*(int *)((long)&pvStack_40->val + (long)local_4e4 * 4) != 0) {
                tcu::TestLog::operator<<
                          ((MessageBuilder *)local_668,_unifNdx,
                           (BeginMessageToken *)&tcu::TestLog::Message);
                pMVar5 = tcu::MessageBuilder::operator<<
                                   ((MessageBuilder *)local_668,
                                    (char (*) [21])"// FAILURE: uniform ");
                pMVar5 = tcu::MessageBuilder::operator<<
                                   (pMVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)unifValue);
                pMVar5 = tcu::MessageBuilder::operator<<
                                   (pMVar5,(char (*) [28])" has non-zero initial value");
                tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_668);
                uniform._7_1_ = 0;
              }
            }
          }
          else {
            bVar3 = glu::isDataTypeBoolOrBVec((unifValue->val).uintV[7]);
            if (bVar3) {
              for (local_66c = 0; local_66c < local_44; local_66c = local_66c + 1) {
                if (((pvStack_40->val).boolV[local_66c] & 1U) != 0) {
                  tcu::TestLog::operator<<
                            (&local_7f0,_unifNdx,(BeginMessageToken *)&tcu::TestLog::Message);
                  pMVar5 = tcu::MessageBuilder::operator<<
                                     (&local_7f0,(char (*) [21])"// FAILURE: uniform ");
                  pMVar5 = tcu::MessageBuilder::operator<<
                                     (pMVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)unifValue);
                  pMVar5 = tcu::MessageBuilder::operator<<
                                     (pMVar5,(char (*) [28])" has non-zero initial value");
                  tcu::MessageBuilder::operator<<
                            (pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
                  tcu::MessageBuilder::~MessageBuilder(&local_7f0);
                  uniform._7_1_ = 0;
                }
              }
            }
            else {
              bVar3 = glu::isDataTypeSampler((unifValue->val).uintV[7]);
              if ((bVar3) && ((pvStack_40->val).intV[0] != 0)) {
                tcu::TestLog::operator<<
                          (&local_970,_unifNdx,(BeginMessageToken *)&tcu::TestLog::Message);
                pMVar5 = tcu::MessageBuilder::operator<<
                                   (&local_970,(char (*) [21])"// FAILURE: uniform ");
                pMVar5 = tcu::MessageBuilder::operator<<
                                   (pMVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)unifValue);
                pMVar5 = tcu::MessageBuilder::operator<<
                                   (pMVar5,(char (*) [28])" has non-zero initial value");
                tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                tcu::MessageBuilder::~MessageBuilder(&local_970);
                uniform._7_1_ = 0;
              }
            }
          }
        }
      }
    }
  }
  return (bool)(uniform._7_1_ & 1);
}

Assistant:

bool UniformCase::checkUniformDefaultValues (const vector<VarValue>& values, const vector<BasicUniform>& basicUniforms)
{
	TestLog&	log			= m_testCtx.getLog();
	bool		success		= true;

	DE_ASSERT(values.size() == basicUniforms.size());

	for (int unifNdx = 0; unifNdx < (int)basicUniforms.size(); unifNdx++)
	{
		const BasicUniform&		uniform		= basicUniforms[unifNdx];
		const VarValue&			unifValue	= values[unifNdx];
		const int				valSize		= glu::getDataTypeScalarSize(uniform.type);

		log << TestLog::Message << "// Checking uniform " << uniform.name << TestLog::EndMessage;

		if (unifValue.type == glu::TYPE_INVALID) // This happens when glGetUniformLocation() returned -1.
			continue;

#define CHECK_UNIFORM(VAR_VALUE_MEMBER, ZERO)																								\
	do																																		\
	{																																		\
		for (int i = 0; i < valSize; i++)																									\
		{																																	\
			if (unifValue.val.VAR_VALUE_MEMBER[i] != (ZERO))																				\
			{																																\
				log << TestLog::Message << "// FAILURE: uniform " << uniform.name << " has non-zero initial value" << TestLog::EndMessage;	\
				success = false;																											\
			}																																\
		}																																	\
	} while (false)

		if (glu::isDataTypeFloatOrVec(uniform.type) || glu::isDataTypeMatrix(uniform.type))
			CHECK_UNIFORM(floatV, 0.0f);
		else if (glu::isDataTypeIntOrIVec(uniform.type))
			CHECK_UNIFORM(intV, 0);
		else if (glu::isDataTypeUintOrUVec(uniform.type))
			CHECK_UNIFORM(uintV, 0);
		else if (glu::isDataTypeBoolOrBVec(uniform.type))
			CHECK_UNIFORM(boolV, false);
		else if (glu::isDataTypeSampler(uniform.type))
		{
			if (unifValue.val.samplerV.unit != 0)
			{
				log << TestLog::Message << "// FAILURE: uniform " << uniform.name << " has non-zero initial value" << TestLog::EndMessage;
				success = false;
			}
		}
		else
			DE_ASSERT(false);

#undef CHECK_UNIFORM
	}

	return success;
}